

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

FFSWriterRec LookupWriterRec(SstStream Stream,void *Key)

{
  int *piVar1;
  int i;
  FFSWriterMarshalBase *Info;
  void *Key_local;
  SstStream Stream_local;
  
  piVar1 = (int *)Stream->WriterMarshalData;
  if (Stream->WriterMarshalData != (void *)0x0) {
    for (i = 0; i < *piVar1; i = i + 1) {
      if (*(void **)(*(long *)(piVar1 + 2) + (long)i * 0x28) == Key) {
        return (FFSWriterRec)(*(long *)(piVar1 + 2) + (long)i * 0x28);
      }
    }
  }
  return (FFSWriterRec)0x0;
}

Assistant:

static FFSWriterRec LookupWriterRec(SstStream Stream, void *Key)
{
    struct FFSWriterMarshalBase *Info = Stream->WriterMarshalData;

    if (!Stream->WriterMarshalData)
        return NULL;

    for (int i = 0; i < Info->RecCount; i++)
    {
        if (Info->RecList[i].Key == Key)
        {
            return &Info->RecList[i];
        }
    }

    return NULL;
}